

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

_Bool compare_lower_str(char *s1,char *s2)

{
  int iVar1;
  char *__s2;
  char *local_30;
  char *c;
  char *lower;
  _Bool res;
  char *s2_local;
  char *s1_local;
  
  __s2 = cs_strdup(s2);
  for (local_30 = __s2; *local_30 != '\0'; local_30 = local_30 + 1) {
    iVar1 = tolower((int)*local_30);
    *local_30 = (char)iVar1;
  }
  iVar1 = strcmp(s1,__s2);
  (*cs_mem_free)(__s2);
  return iVar1 == 0;
}

Assistant:

static bool compare_lower_str(char *s1, char *s2)
{
	bool res;
	char *lower = cs_strdup(s2), *c;
	for (c = lower; *c; c++)
		*c = (char)tolower((int) *c);

	res = (strcmp(s1, lower) == 0);
	cs_mem_free(lower);

	return res;
}